

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O2

void write_global(mtree_writer *mtree)

{
  wchar_t wVar1;
  attr_counter *paVar2;
  mtree_entry_conflict *pmVar3;
  unsigned_long uVar4;
  wchar_t wVar5;
  wchar_t wVar6;
  char *p;
  wchar_t wVar7;
  uint uVar8;
  bool bVar9;
  archive_string local_68;
  archive_string local_48;
  
  local_68.buffer_length = 0;
  local_48.buffer_length = 0;
  local_68.s = (char *)0x0;
  local_68.length = 0;
  local_48.s = (char *)0x0;
  local_48.length = 0;
  wVar1 = (mtree->set).keys;
  wVar6 = mtree->keys;
  wVar7 = wVar6 & 0x380238;
  if ((mtree->set).processing == L'\0') {
    wVar6 = wVar6 & 0x80238;
    if ((mtree->acs).uid_list != (attr_counter *)0x0) {
      wVar6 = wVar7;
    }
    wVar5 = wVar6 & 0x380208;
    if ((mtree->acs).gid_list != (attr_counter *)0x0) {
      wVar5 = wVar6;
    }
    wVar6 = wVar5 & 0x380038;
    if ((mtree->acs).mode_list != (attr_counter *)0x0) {
      wVar6 = wVar5;
    }
    wVar5 = wVar7;
    wVar7 = wVar6 & 0x380230;
    if ((mtree->acs).flags_list != (attr_counter *)0x0) {
      wVar7 = wVar6;
    }
  }
  else {
    paVar2 = (mtree->acs).uid_list;
    if ((paVar2 == (attr_counter *)0x0) ||
       ((wVar5 = wVar6 & 0x300238, (wVar1 & 0x300000U) != 0 &&
        ((paVar2->count < L'\x02' || ((mtree->set).uid == paVar2->m_entry->uid)))))) {
      wVar5 = wVar6 & 0x238;
    }
    paVar2 = (mtree->acs).gid_list;
    if ((paVar2 == (attr_counter *)0x0) ||
       (((wVar1 & 0x30U) != 0 &&
        ((paVar2->count < L'\x02' || ((mtree->set).gid == paVar2->m_entry->gid)))))) {
      wVar5 = wVar5 & 0x300208;
    }
    paVar2 = (mtree->acs).mode_list;
    if ((paVar2 == (attr_counter *)0x0) ||
       ((((uint)wVar1 >> 9 & 1) != 0 &&
        ((paVar2->count < L'\x02' || ((mtree->set).mode == paVar2->m_entry->mode)))))) {
      wVar5 = wVar5 & 0x3ffdff;
    }
    paVar2 = (mtree->acs).flags_list;
    if ((paVar2 == (attr_counter *)0x0) ||
       (((wVar1 & 8U) != 0 &&
        ((paVar2->count < L'\x02' ||
         ((paVar2->m_entry->fflags_set == (mtree->set).fflags_set &&
          (paVar2->m_entry->fflags_clear == (mtree->set).fflags_clear)))))))) {
      wVar5 = wVar5 & 0xfffffff7;
    }
  }
  if (((uint)(wVar5 & wVar7) >> 0x13 & 1) != 0) {
    bVar9 = mtree->dironly == L'\0';
    p = " type=dir";
    if (bVar9) {
      p = " type=file";
    }
    archive_strcat(&local_68,p);
    (mtree->set).type = (uint)bVar9 * 0x4000 + 0x4000;
  }
  if ((uint)(wVar5 & wVar7) >> 0x15 != 0) {
    if ((((mtree->acs).uid_list)->m_entry->uname).length == 0) {
      wVar7 = wVar7 & 0x1fffff;
      if (((uint)wVar1 >> 0x15 & 1) != 0) {
        archive_strcat(&local_48," uname");
      }
    }
    else {
      archive_strcat(&local_68," uname=");
      mtree_quote(&local_68,(((mtree->acs).uid_list)->m_entry->uname).s);
    }
  }
  if (((uint)(wVar7 & wVar5) >> 0x14 & 1) != 0) {
    (mtree->set).uid = ((mtree->acs).uid_list)->m_entry->uid;
    archive_string_sprintf(&local_68," uid=%jd");
  }
  if ((wVar7 & wVar5 & 0x20U) != 0) {
    if ((((mtree->acs).gid_list)->m_entry->gname).length == 0) {
      wVar7 = wVar7 & 0xffffffdf;
      if ((wVar1 & 0x20U) != 0) {
        archive_strcat(&local_48," gname");
      }
    }
    else {
      archive_strcat(&local_68," gname=");
      mtree_quote(&local_68,(((mtree->acs).gid_list)->m_entry->gname).s);
    }
  }
  uVar8 = wVar5 & wVar7;
  if ((uVar8 & 0x10) != 0) {
    (mtree->set).gid = ((mtree->acs).gid_list)->m_entry->gid;
    archive_string_sprintf(&local_68," gid=%jd");
  }
  if ((uVar8 >> 9 & 1) != 0) {
    (mtree->set).mode = ((mtree->acs).mode_list)->m_entry->mode;
    archive_string_sprintf(&local_68," mode=%o");
  }
  if ((uVar8 & 8) != 0) {
    if ((((mtree->acs).flags_list)->m_entry->fflags_text).length == 0) {
      wVar7 = wVar7 & 0xfffffff7;
      if ((wVar1 & 8U) != 0) {
        archive_strcat(&local_48," flags");
      }
    }
    else {
      archive_strcat(&local_68," flags=");
      mtree_quote(&local_68,(((mtree->acs).flags_list)->m_entry->fflags_text).s);
      pmVar3 = ((mtree->acs).flags_list)->m_entry;
      uVar4 = pmVar3->fflags_clear;
      (mtree->set).fflags_set = pmVar3->fflags_set;
      (mtree->set).fflags_clear = uVar4;
    }
  }
  if (local_48.length != 0) {
    archive_string_sprintf(&mtree->buf,"/unset%s\n",local_48.s);
  }
  archive_string_free(&local_48);
  if (local_68.length != 0) {
    archive_string_sprintf(&mtree->buf,"/set%s\n",local_68.s);
  }
  archive_string_free(&local_68);
  (mtree->set).keys = wVar7;
  (mtree->set).processing = L'\x01';
  return;
}

Assistant:

static void
write_global(struct mtree_writer *mtree)
{
	struct archive_string setstr;
	struct archive_string unsetstr;
	struct att_counter_set *acs;
	int keys, oldkeys, effkeys;

	archive_string_init(&setstr);
	archive_string_init(&unsetstr);
	keys = mtree->keys & SET_KEYS;
	oldkeys = mtree->set.keys;
	effkeys = keys;
	acs = &mtree->acs;
	if (mtree->set.processing) {
		/*
		 * Check if the global data needs updating.
		 */
		effkeys &= ~F_TYPE;
		if (acs->uid_list == NULL)
			effkeys &= ~(F_UNAME | F_UID);
		else if (oldkeys & (F_UNAME | F_UID)) {
			if (acs->uid_list->count < 2 ||
			    mtree->set.uid == acs->uid_list->m_entry->uid)
				effkeys &= ~(F_UNAME | F_UID);
		}
		if (acs->gid_list == NULL)
			effkeys &= ~(F_GNAME | F_GID);
		else if (oldkeys & (F_GNAME | F_GID)) {
			if (acs->gid_list->count < 2 ||
			    mtree->set.gid == acs->gid_list->m_entry->gid)
				effkeys &= ~(F_GNAME | F_GID);
		}
		if (acs->mode_list == NULL)
			effkeys &= ~F_MODE;
		else if (oldkeys & F_MODE) {
			if (acs->mode_list->count < 2 ||
			    mtree->set.mode == acs->mode_list->m_entry->mode)
				effkeys &= ~F_MODE;
		}
		if (acs->flags_list == NULL)
			effkeys &= ~F_FLAGS;
		else if ((oldkeys & F_FLAGS) != 0) {
			if (acs->flags_list->count < 2 ||
			    (acs->flags_list->m_entry->fflags_set ==
				mtree->set.fflags_set &&
			     acs->flags_list->m_entry->fflags_clear ==
				mtree->set.fflags_clear))
				effkeys &= ~F_FLAGS;
		}
	} else {
		if (acs->uid_list == NULL)
			keys &= ~(F_UNAME | F_UID);
		if (acs->gid_list == NULL)
			keys &= ~(F_GNAME | F_GID);
		if (acs->mode_list == NULL)
			keys &= ~F_MODE;
		if (acs->flags_list == NULL)
			keys &= ~F_FLAGS;
	}
	if ((keys & effkeys & F_TYPE) != 0) {
		if (mtree->dironly) {
			archive_strcat(&setstr, " type=dir");
			mtree->set.type = AE_IFDIR;
		} else {
			archive_strcat(&setstr, " type=file");
			mtree->set.type = AE_IFREG;
		}
	}
	if ((keys & effkeys & F_UNAME) != 0) {
		if (archive_strlen(&(acs->uid_list->m_entry->uname)) > 0) {
			archive_strcat(&setstr, " uname=");
			mtree_quote(&setstr, acs->uid_list->m_entry->uname.s);
		} else {
			keys &= ~F_UNAME;
			if ((oldkeys & F_UNAME) != 0)
				archive_strcat(&unsetstr, " uname");
		}
	}
	if ((keys & effkeys & F_UID) != 0) {
		mtree->set.uid = acs->uid_list->m_entry->uid;
		archive_string_sprintf(&setstr, " uid=%jd",
		    (intmax_t)mtree->set.uid);
	}
	if ((keys & effkeys & F_GNAME) != 0) {
		if (archive_strlen(&(acs->gid_list->m_entry->gname)) > 0) {
			archive_strcat(&setstr, " gname=");
			mtree_quote(&setstr, acs->gid_list->m_entry->gname.s);
		} else {
			keys &= ~F_GNAME;
			if ((oldkeys & F_GNAME) != 0)
				archive_strcat(&unsetstr, " gname");
		}
	}
	if ((keys & effkeys & F_GID) != 0) {
		mtree->set.gid = acs->gid_list->m_entry->gid;
		archive_string_sprintf(&setstr, " gid=%jd",
		    (intmax_t)mtree->set.gid);
	}
	if ((keys & effkeys & F_MODE) != 0) {
		mtree->set.mode = acs->mode_list->m_entry->mode;
		archive_string_sprintf(&setstr, " mode=%o",
		    (unsigned int)mtree->set.mode);
	}
	if ((keys & effkeys & F_FLAGS) != 0) {
		if (archive_strlen(
		    &(acs->flags_list->m_entry->fflags_text)) > 0) {
			archive_strcat(&setstr, " flags=");
			mtree_quote(&setstr,
			    acs->flags_list->m_entry->fflags_text.s);
			mtree->set.fflags_set =
			    acs->flags_list->m_entry->fflags_set;
			mtree->set.fflags_clear =
			    acs->flags_list->m_entry->fflags_clear;
		} else {
			keys &= ~F_FLAGS;
			if ((oldkeys & F_FLAGS) != 0)
				archive_strcat(&unsetstr, " flags");
		}
	}
	if (unsetstr.length > 0)
		archive_string_sprintf(&mtree->buf, "/unset%s\n", unsetstr.s);
	archive_string_free(&unsetstr);
	if (setstr.length > 0)
		archive_string_sprintf(&mtree->buf, "/set%s\n", setstr.s);
	archive_string_free(&setstr);
	mtree->set.keys = keys;
	mtree->set.processing = 1;
}